

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::WeightParams::ByteSizeLong(WeightParams *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  
  uVar4 = (ulong)(uint)(this->floatvalue_).current_size_;
  if (uVar4 == 0) {
    lVar6 = 0;
  }
  else {
    uVar5 = ((long)(uVar4 << 0x22) >> 0x20) + 1;
    lVar6 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    lVar6 = (ulong)((int)lVar6 * 9 + 0x49U >> 6) + 1;
  }
  sVar7 = lVar6 + uVar4 * 4;
  lVar6 = *(long *)(((ulong)(this->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar6 != 0) {
    uVar3 = (uint)lVar6 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + lVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  lVar6 = *(long *)(((ulong)(this->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar6 != 0) {
    uVar3 = (uint)lVar6 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + lVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  lVar6 = *(long *)(((ulong)(this->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar6 != 0) {
    uVar3 = (uint)lVar6 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + lVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->quantization_ != (QuantizationParams *)0x0 &&
      this != (WeightParams *)_WeightParams_default_instance_) {
    sVar2 = QuantizationParams::ByteSizeLong(this->quantization_);
    uVar3 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar2 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  sVar2 = sVar7 + 3;
  if (this->isupdatable_ == false) {
    sVar2 = sVar7;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t WeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.WeightParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_floatvalue_size());
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // bytes float16Value = 2;
  if (!this->_internal_float16value().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_float16value());
  }

  // bytes rawValue = 30;
  if (!this->_internal_rawvalue().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_rawvalue());
  }

  // bytes int8RawValue = 31;
  if (!this->_internal_int8rawvalue().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
        this->_internal_int8rawvalue());
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->_internal_has_quantization()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *quantization_);
  }

  // bool isUpdatable = 50;
  if (this->_internal_isupdatable() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}